

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall
ON_Viewport::GetCoordinateSprite
          (ON_Viewport *this,int size,int scrx,int scry,int *indx,double (*scr_coord) [2])

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double *pdVar4;
  double *CameraZ;
  long lVar5;
  long lVar6;
  ON_3dPoint *__return_storage_ptr__;
  double dVar7;
  double dVar8;
  double dVar9;
  ON_3dPoint C;
  ON_3dPoint local_1a0;
  ON_3dPoint local_188;
  ON_3dVector Z;
  ON_3dVector X;
  ON_3dVector Scr [3];
  ON_3dPoint ZP;
  ON_3dPoint YP;
  ON_Xform w2s;
  
  indx[0] = 0;
  indx[1] = 1;
  dVar7 = (double)scrx;
  dVar8 = (double)scry;
  indx[2] = 2;
  scr_coord[2][0] = dVar7;
  scr_coord[2][1] = dVar8;
  scr_coord[1][0] = dVar7;
  scr_coord[1][1] = dVar8;
  (*scr_coord)[0] = dVar7;
  (*scr_coord)[1] = dVar8;
  ON_Xform::ON_Xform(&w2s);
  pdVar4 = ON_3dPoint::operator_cast_to_double_(&C);
  bVar3 = GetFrustumCenter(this,pdVar4);
  if (bVar3) {
    pdVar4 = ON_3dVector::operator_cast_to_double_(&X);
    CameraZ = ON_3dVector::operator_cast_to_double_(&Z);
    bVar3 = GetCameraFrame(this,(double *)0x0,pdVar4,(double *)0x0,CameraZ);
    if (!bVar3) {
      return false;
    }
    bVar3 = GetXform(this,world_cs,screen_cs,&w2s);
    if (!bVar3) {
      return false;
    }
    for (lVar5 = 0; lVar6 = lVar5, lVar5 != 2; lVar5 = lVar5 + 1) {
      for (; lVar6 != 2; lVar6 = lVar6 + 1) {
        pdVar4 = ON_3dVector::operator[](&Z,indx[lVar5]);
        dVar1 = *pdVar4;
        pdVar4 = ON_3dVector::operator[](&Z,indx[lVar6 + 1]);
        if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
          iVar2 = indx[lVar5];
          indx[lVar5] = indx[lVar6 + 1];
          indx[lVar6 + 1] = iVar2;
        }
      }
    }
    ON_3dPoint::operator+(&local_188,&C,&X);
    ON_Xform::operator*((ON_3dPoint *)Scr,&w2s,&C);
    dVar1 = Scr[0].x;
    __return_storage_ptr__ = (ON_3dPoint *)Scr;
    ON_Xform::operator*(__return_storage_ptr__,&w2s,&local_188);
    if ((dVar1 != Scr[0].x) || (NAN(dVar1) || NAN(Scr[0].x))) {
      dVar9 = (double)size / ABS(dVar1 - Scr[0].x);
      local_188.y = C.y;
      local_188.z = C.z;
      local_188.x = C.x + dVar9;
      YP.x = C.x;
      YP.z = C.z;
      YP.y = C.y + dVar9;
      ZP.x = C.x;
      ZP.y = C.y;
      ZP.z = dVar9 + C.z;
      ON_Xform::operator*(&local_1a0,&w2s,&local_188);
      ON_3dVector::operator=((ON_3dVector *)__return_storage_ptr__,&local_1a0);
      ON_Xform::operator*(&local_1a0,&w2s,&YP);
      ON_3dVector::operator=(Scr + 1,&local_1a0);
      ON_Xform::operator*(&local_1a0,&w2s,&ZP);
      ON_3dVector::operator=(Scr + 2,&local_1a0);
      for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 0x10) {
        dVar9 = __return_storage_ptr__->y;
        pdVar4 = (double *)((long)*scr_coord + lVar5);
        *pdVar4 = __return_storage_ptr__->x + (dVar7 - dVar1);
        pdVar4[1] = dVar9 + (dVar8 - Scr[0].y);
        __return_storage_ptr__ = __return_storage_ptr__ + 1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::GetCoordinateSprite( 
                     int size, 
                     int scrx, int scry,
                     int indx[3], // axis order by depth
                     double scr_coord[3][2] ) const
{
  // size = length of axes in pixels

  indx[0] = 0; indx[1] = 1; indx[2] = 2;
  scr_coord[0][0] = scr_coord[1][0] = scr_coord[2][0] = scrx;
  scr_coord[0][1] = scr_coord[1][1] = scr_coord[2][1] = scry;

  ON_3dPoint C, XP, YP, ZP, ScrC, ScrXP;
  ON_3dVector X, Z, Scr[3];
  ON_Xform w2s;
  if (!GetFrustumCenter( C ) )
    return false;
  if (!GetCameraFrame( nullptr, X, nullptr, Z )) 
    return false;
  if (!GetXform( ON::world_cs, ON::screen_cs, w2s )) 
    return false;

  // indx[] determines order that axes are drawn
  // sorted from back to front
  int i,j,k;
  for (i = 0; i < 2; i++) for (j = i+1; j <= 2; j++) {
    if (Z[indx[i]] > Z[indx[j]])
      {k = indx[i]; indx[i] = indx[j]; indx[j] = k;}
  }

  // determine world length that corresponds to size pixels
  XP = C+X;
  ScrC = w2s*C;
  ScrXP = w2s*XP;
  if (ScrC.x == ScrXP.x)
    return false;
  double s = size/fabs( ScrC.x - ScrXP.x );

  // transform world coord axes to screen
  XP = C;
  XP.x += s;
  YP = C;
  YP.y += s;
  ZP = C;
  ZP.z += s;
  Scr[0] = w2s*XP;
  Scr[1] = w2s*YP;
  Scr[2] = w2s*ZP;
  
  double dx = scrx - ScrC.x;
  double dy = scry - ScrC.y;
  for (i=0;i<3;i++) {
    scr_coord[i][0] = dx + Scr[i].x; 
    scr_coord[i][1] = dy + Scr[i].y;
  }

  return true;
}